

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall QCss::Parser::parseExpr(Parser *this,QList<QCss::Value> *values)

{
  bool bVar1;
  bool bVar2;
  Parser *in_RDI;
  long in_FS_OFFSET;
  bool onceMore;
  Value val;
  parameter_type in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  bool local_81;
  Value *in_stack_ffffffffffffff88;
  Parser *in_stack_ffffffffffffff90;
  int local_30 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_30,0xaa,0x28);
  Value::Value((Value *)0xa3ce34);
  bVar1 = parseTerm(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    QList<QCss::Value>::append
              ((QList<QCss::Value> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    do {
      bVar1 = false;
      Value::Value((Value *)0xa3ce82);
      Value::operator=((Value *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48);
      Value::~Value((Value *)0xa3ce9e);
      bVar2 = parseNextOperator(in_RDI,(Value *)CONCAT17(in_stack_ffffffffffffff57,
                                                         in_stack_ffffffffffffff50));
      if (!bVar2) {
        local_81 = false;
        goto LAB_00a3cf6e;
      }
      if (local_30[0] != 0) {
        QList<QCss::Value>::append
                  ((QList<QCss::Value> *)
                   CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
      }
      bVar2 = testTerm((Parser *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      if (bVar2) {
        bVar1 = true;
        Value::Value((Value *)0xa3cf01);
        Value::operator=((Value *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff48);
        Value::~Value((Value *)0xa3cf1d);
        bVar2 = parseTerm(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        if (!bVar2) {
          local_81 = false;
          goto LAB_00a3cf6e;
        }
        QList<QCss::Value>::append
                  ((QList<QCss::Value> *)
                   CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
      }
    } while (bVar1);
    local_81 = true;
  }
  else {
    local_81 = false;
  }
LAB_00a3cf6e:
  Value::~Value((Value *)0xa3cf7b);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_81;
}

Assistant:

bool Parser::parseExpr(QList<Value> *values)
{
    Value val;
    if (!parseTerm(&val)) return false;
    values->append(val);
    bool onceMore;
    do {
        onceMore = false;
        val = Value();
        if (!parseNextOperator(&val)) return false;
        if (val.type != QCss::Value::Unknown)
            values->append(val);
        if (testTerm()) {
            onceMore = true;
            val = Value();
            if (!parseTerm(&val)) return false;
            values->append(val);
        }
    } while (onceMore);
    return true;
}